

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

Type * __thiscall
slang::ast::Compilation::getType
          (Compilation *this,bitwidth_t width,bitmask<slang::ast::IntegralFlags> flags)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  value_type *elements;
  ulong hash;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  try_emplace_args_t local_6d;
  uint local_6c;
  ulong local_68;
  PackedArrayType *type;
  bitwidth_t width_local;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
  *local_50;
  locator res;
  
  local_6c = (uint)flags.m_bits << 0x18 | width;
  uVar7 = SUB168(ZEXT416(local_6c) * ZEXT816(0x9e3779b97f4a7c15),8) ^
          SUB168(ZEXT416(local_6c) * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar10 = uVar7 >> ((byte)(this->vectorTypeCache).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                           .arrays.groups_size_index & 0x3f);
  local_50 = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
              *)&this->vectorTypeCache;
  pgVar4 = (this->vectorTypeCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar7 & 0xff];
  ppVar5 = (this->vectorTypeCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
           .arrays.elements_;
  local_68 = (this->vectorTypeCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             .arrays.groups_size_mask;
  uVar8 = 0;
  do {
    pgVar2 = pgVar4 + uVar10;
    uVar12 = (uchar)uVar3;
    auVar16[0] = -(pgVar2->m[0].n == uVar12);
    uVar13 = (uchar)((uint)uVar3 >> 8);
    auVar16[1] = -(pgVar2->m[1].n == uVar13);
    uVar14 = (uchar)((uint)uVar3 >> 0x10);
    auVar16[2] = -(pgVar2->m[2].n == uVar14);
    uVar15 = (uchar)((uint)uVar3 >> 0x18);
    auVar16[3] = -(pgVar2->m[3].n == uVar15);
    auVar16[4] = -(pgVar2->m[4].n == uVar12);
    auVar16[5] = -(pgVar2->m[5].n == uVar13);
    auVar16[6] = -(pgVar2->m[6].n == uVar14);
    auVar16[7] = -(pgVar2->m[7].n == uVar15);
    auVar16[8] = -(pgVar2->m[8].n == uVar12);
    auVar16[9] = -(pgVar2->m[9].n == uVar13);
    auVar16[10] = -(pgVar2->m[10].n == uVar14);
    auVar16[0xb] = -(pgVar2->m[0xb].n == uVar15);
    auVar16[0xc] = -(pgVar2->m[0xc].n == uVar12);
    auVar16[0xd] = -(pgVar2->m[0xd].n == uVar13);
    auVar16[0xe] = -(pgVar2->m[0xe].n == uVar14);
    auVar16[0xf] = -(pgVar2->m[0xf].n == uVar15);
    for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
        uVar9 = uVar9 - 1 & uVar9) {
      iVar6 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (local_6c == *(uint *)((long)&ppVar5[uVar10 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
        lVar11 = (long)&ppVar5[uVar10 * 0xf].first + (ulong)(uint)(iVar6 << 4);
        goto LAB_0018165f;
      }
    }
    if ((pgVar4[uVar10].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar7 & 7]) == 0) break;
    lVar11 = uVar10 + uVar8;
    uVar8 = uVar8 + 1;
    uVar10 = lVar11 + 1U & local_68;
  } while (uVar8 <= local_68);
  lVar11 = 0;
LAB_0018165f:
  if (lVar11 == 0) {
    res.pg._0_4_ = width - 1;
    res.pg._4_4_ = 0;
    width_local = width;
    type = BumpAllocator::
           emplace<slang::ast::PackedArrayType,slang::ast::Type_const&,slang::ConstantRange,unsigned_int&>
                     (&this->super_BumpAllocator,this->scalarTypeTable[flags.m_bits & 7],
                      (ConstantRange *)&res,&width_local);
    hash = SUB168(ZEXT416(local_6c) * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(ZEXT416(local_6c) * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar8 = hash >> ((byte)(this->vectorTypeCache).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                           .arrays.groups_size_index & 0x3f);
    pgVar4 = (this->vectorTypeCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             .arrays.groups_;
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[hash & 0xff];
    ppVar5 = (this->vectorTypeCache).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
             .arrays.elements_;
    local_68 = (this->vectorTypeCache).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
               .arrays.groups_size_mask;
    uVar10 = 0;
    uVar7 = uVar8;
    do {
      pgVar2 = pgVar4 + uVar7;
      uVar12 = (uchar)uVar3;
      auVar17[0] = -(pgVar2->m[0].n == uVar12);
      uVar13 = (uchar)((uint)uVar3 >> 8);
      auVar17[1] = -(pgVar2->m[1].n == uVar13);
      uVar14 = (uchar)((uint)uVar3 >> 0x10);
      auVar17[2] = -(pgVar2->m[2].n == uVar14);
      uVar15 = (uchar)((uint)uVar3 >> 0x18);
      auVar17[3] = -(pgVar2->m[3].n == uVar15);
      auVar17[4] = -(pgVar2->m[4].n == uVar12);
      auVar17[5] = -(pgVar2->m[5].n == uVar13);
      auVar17[6] = -(pgVar2->m[6].n == uVar14);
      auVar17[7] = -(pgVar2->m[7].n == uVar15);
      auVar17[8] = -(pgVar2->m[8].n == uVar12);
      auVar17[9] = -(pgVar2->m[9].n == uVar13);
      auVar17[10] = -(pgVar2->m[10].n == uVar14);
      auVar17[0xb] = -(pgVar2->m[0xb].n == uVar15);
      auVar17[0xc] = -(pgVar2->m[0xc].n == uVar12);
      auVar17[0xd] = -(pgVar2->m[0xd].n == uVar13);
      auVar17[0xe] = -(pgVar2->m[0xe].n == uVar14);
      auVar17[0xf] = -(pgVar2->m[0xf].n == uVar15);
      for (uVar9 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe); uVar9 != 0;
          uVar9 = uVar9 - 1 & uVar9) {
        iVar6 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        if (local_6c == *(uint *)((long)&ppVar5[uVar7 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
          if ((long)&ppVar5[uVar7 * 0xf].first + (ulong)(uint)(iVar6 << 4) != 0) {
            return (Type *)type;
          }
          goto LAB_00181793;
        }
      }
      if ((pgVar4[uVar7].m[0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7]) == 0) break;
      lVar11 = uVar7 + uVar10;
      uVar10 = uVar10 + 1;
      uVar7 = lVar11 + 1U & local_68;
    } while (uVar10 <= local_68);
LAB_00181793:
    if ((this->vectorTypeCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
        .size_ctrl.size <
        (this->vectorTypeCache).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
                (&res,local_50,(arrays_type *)local_50,uVar8,hash,&local_6d,&local_6c,&type);
      psVar1 = &(this->vectorTypeCache).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<unsigned_int,_const_slang::ast::Type_*>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_slang::ast::Type_*>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<unsigned_int,slang::ast::Type_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_int,void>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,slang::ast::Type_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_int&,slang::ast::PackedArrayType*&>
                (&res,local_50,hash,&local_6d,&local_6c,&type);
    }
  }
  else {
    type = *(PackedArrayType **)(lVar11 + 8);
  }
  return (Type *)type;
}

Assistant:

const Type& Compilation::getType(bitwidth_t width, bitmask<IntegralFlags> flags) {
    SLANG_ASSERT(width > 0 && width <= SVInt::MAX_BITS);
    uint32_t key = width;
    key |= uint32_t(flags.bits()) << SVInt::BITWIDTH_BITS;
    auto it = vectorTypeCache.find(key);
    if (it != vectorTypeCache.end())
        return *it->second;

    SLANG_ASSERT(!isFrozen());

    auto type = emplace<PackedArrayType>(getScalarType(flags), ConstantRange{int32_t(width - 1), 0},
                                         width);
    vectorTypeCache.emplace_hint(it, key, type);
    return *type;
}